

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

string * __thiscall
Options::demandOptionsToStr_abi_cxx11_(string *__return_storage_ptr__,Options *this)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream s;
  long local_198;
  undefined8 local_190 [2];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xffffff4f | 0x20;
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 4;
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"DEMAND_MODEL",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_198,this->stringOptions[5]._M_dataplus._M_p,
                      this->stringOptions[5]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"DEMAND_PATTERN",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_198,this->stringOptions[10]._M_dataplus._M_p,
                      this->stringOptions[10]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"DEMAND_MULTIPLIER",0x11)
  ;
  poVar1 = std::ostream::_M_insert<double>(this->valueOptions[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"MINIMUM_PRESSURE",0x10);
  poVar1 = std::ostream::_M_insert<double>(this->valueOptions[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"SERVICE_PRESSURE",0x10);
  poVar1 = std::ostream::_M_insert<double>(this->valueOptions[4]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"PRESSURE_EXPONENT",0x11)
  ;
  poVar1 = std::ostream::_M_insert<double>(this->valueOptions[5]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"LEAKAGE_MODEL",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_198,this->stringOptions[6]._M_dataplus._M_p,
                      this->stringOptions[6]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"LEAKAGE_COEFF1",0xe);
  poVar1 = std::ostream::_M_insert<double>(this->valueOptions[7]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"LEAKAGE_COEFF2",0xe);
  poVar1 = std::ostream::_M_insert<double>(this->valueOptions[8]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0x1a;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"EMITTER_EXPONENT",0x10);
  poVar1 = std::ostream::_M_insert<double>(this->valueOptions[6]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string Options::demandOptionsToStr()
{
    int w = 26;
    stringstream s;
    s << left << fixed << setprecision(4);
    s << setw(w) << "DEMAND_MODEL";
    s << stringOptions[DEMAND_MODEL] << "\n";
    s << setw(w) << "DEMAND_PATTERN";
    s << stringOptions[DEMAND_PATTERN_NAME] << "\n";
    s << setw(w) << "DEMAND_MULTIPLIER";
    s << valueOptions[DEMAND_MULTIPLIER] << "\n";
    s << setw(w) << "MINIMUM_PRESSURE";
    s << valueOptions[MINIMUM_PRESSURE] << "\n";
    s << setw(w) << "SERVICE_PRESSURE";
    s << valueOptions[SERVICE_PRESSURE] << "\n";
    s << setw(w) << "PRESSURE_EXPONENT";
    s << valueOptions[PRESSURE_EXPONENT] << "\n\n";

    s << setw(w) << "LEAKAGE_MODEL";
    s << stringOptions[LEAKAGE_MODEL] << "\n";
    s << setw(w) << "LEAKAGE_COEFF1";
    s << valueOptions[LEAKAGE_COEFF1] << "\n";
    s << setw(w) << "LEAKAGE_COEFF2";
    s << valueOptions[LEAKAGE_COEFF2] << "\n";
    s << setw(w) << "EMITTER_EXPONENT";
    s << valueOptions[EMITTER_EXPONENT] << "\n";

    return s.str();
}